

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O3

int __thiscall DIS::IntercomControlPdu::getMarshalledSize(IntercomControlPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  long lVar6;
  IntercomCommunicationsParameters listElement;
  IntercomCommunicationsParameters local_40;
  
  iVar1 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  iVar2 = EntityID::getMarshalledSize(&this->_sourceEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_masterEntityID);
  iVar1 = iVar3 + iVar2 + iVar1 + 0xd;
  pIVar4 = (this->_intercomParameters).
           super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_intercomParameters).
      super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar4) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      local_40._vptr_IntercomCommunicationsParameters =
           (_func_int **)&PTR__IntercomCommunicationsParameters_001a0438;
      local_40._8_8_ =
           *(undefined8 *)((long)&pIVar4->_vptr_IntercomCommunicationsParameters + lVar6);
      iVar2 = IntercomCommunicationsParameters::getMarshalledSize(&local_40);
      iVar1 = iVar1 + iVar2;
      IntercomCommunicationsParameters::~IntercomCommunicationsParameters(&local_40);
      uVar5 = uVar5 + 1;
      pIVar4 = (this->_intercomParameters).
               super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_intercomParameters).
                                   super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 4));
  }
  return iVar1;
}

Assistant:

int IntercomControlPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _controlType
   marshalSize = marshalSize + 1;  // _communicationsChannelType
   marshalSize = marshalSize + _sourceEntityID.getMarshalledSize();  // _sourceEntityID
   marshalSize = marshalSize + 1;  // _sourceCommunicationsDeviceID
   marshalSize = marshalSize + 1;  // _sourceLineID
   marshalSize = marshalSize + 1;  // _transmitPriority
   marshalSize = marshalSize + 1;  // _transmitLineState
   marshalSize = marshalSize + 1;  // _command
   marshalSize = marshalSize + _masterEntityID.getMarshalledSize();  // _masterEntityID
   marshalSize = marshalSize + 2;  // _masterCommunicationsDeviceID
   marshalSize = marshalSize + 4;  // _intercomParametersLength

   for(unsigned long long idx=0; idx < _intercomParameters.size(); idx++)
   {
        IntercomCommunicationsParameters listElement = _intercomParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}